

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int n;
  long *plVar1;
  codebook *book;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  plVar1 = *vl;
  iVar3 = vb->pcmend * ch >> 1;
  if (plVar1[1] < (long)iVar3) {
    iVar3 = (int)plVar1[1];
  }
  iVar3 = iVar3 - (int)*plVar1;
  if (0 < iVar3) {
    n = (int)plVar1[2];
    iVar3 = iVar3 / n;
    iVar2 = (int)**(undefined8 **)((long)vl + 0x18);
    pvVar5 = _vorbis_block_alloc(vb,(long)((iVar2 + iVar3 + -1) / iVar2) << 3);
    lVar6 = (long)ch;
    lVar9 = 0;
    lVar10 = 0;
    if (0 < lVar6) {
      lVar10 = lVar6;
    }
    for (; (lVar7 = lVar10, lVar10 != lVar9 && (lVar7 = lVar9, nonzero[lVar9] == 0));
        lVar9 = lVar9 + 1) {
    }
    if (lVar7 != lVar6) {
      for (lVar10 = 0; lVar10 < *(int *)((long)vl + 0xc); lVar10 = lVar10 + 1) {
        lVar9 = 0;
        lVar6 = 0;
        while (lVar6 < iVar3) {
          if (lVar10 == 0) {
            lVar7 = vorbis_book_decode(*(codebook **)((long)vl + 0x18),&vb->opb);
            iVar4 = (int)lVar7;
            if (iVar4 == -1) {
              return 0;
            }
            if ((int)plVar1[3] <= iVar4) {
              return 0;
            }
            lVar7 = *(long *)(*(long *)((long)vl + 0x30) + (long)iVar4 * 8);
            *(long *)((long)pvVar5 + lVar9 * 8) = lVar7;
            if (lVar7 == 0) {
              return 0;
            }
          }
          lVar7 = n * lVar6;
          for (lVar11 = 0; (lVar11 < iVar2 && (lVar6 + lVar11 < (long)iVar3)); lVar11 = lVar11 + 1)
          {
            lVar8 = (long)*(int *)(*(long *)((long)pvVar5 + lVar9 * 8) + lVar11 * 4);
            if (((*(uint *)((long)plVar1 + lVar8 * 4 + 0x20) & 1 << ((byte)lVar10 & 0x1f)) != 0) &&
               ((book = *(codebook **)
                         (*(long *)(*(long *)((long)vl + 0x20) + lVar8 * 8) + lVar10 * 8),
                book != (codebook *)0x0 &&
                (lVar8 = vorbis_book_decodevv_add(book,in,*plVar1 + lVar7,ch,&vb->opb,n),
                lVar8 == -1)))) {
              return 0;
            }
            lVar7 = lVar7 + n;
          }
          lVar9 = lVar9 + 1;
          lVar6 = lVar6 + lVar11;
        }
      }
    }
  }
  return 0;
}

Assistant:

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  long i,k,l,s;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)vl;
  vorbis_info_residue0 *info=look->info;

  /* move all this setup out later */
  int samples_per_partition=info->grouping;
  int partitions_per_word=look->phrasebook->dim;
  int max=(vb->pcmend*ch)>>1;
  int end=(info->end<max?info->end:max);
  int n=end-info->begin;

  if(n>0){
    int partvals=n/samples_per_partition;
    int partwords=(partvals+partitions_per_word-1)/partitions_per_word;
    int **partword=_vorbis_block_alloc(vb,partwords*sizeof(*partword));

    for(i=0;i<ch;i++)if(nonzero[i])break;
    if(i==ch)return(0); /* no nonzero vectors */

    for(s=0;s<look->stages;s++){
      for(i=0,l=0;i<partvals;l++){

        if(s==0){
          /* fetch the partition word */
          int temp=vorbis_book_decode(look->phrasebook,&vb->opb);
          if(temp==-1 || temp>=info->partvals)goto eopbreak;
          partword[l]=look->decodemap[temp];
          if(partword[l]==NULL)goto errout;
        }

        /* now we decode residual values for the partitions */
        for(k=0;k<partitions_per_word && i<partvals;k++,i++)
          if(info->secondstages[partword[l][k]]&(1<<s)){
            codebook *stagebook=look->partbooks[partword[l][k]][s];

            if(stagebook){
              if(vorbis_book_decodevv_add(stagebook,in,
                                          i*samples_per_partition+info->begin,ch,
                                          &vb->opb,samples_per_partition)==-1)
                goto eopbreak;
            }
          }
      }
    }
  }
 errout:
 eopbreak:
  return(0);
}